

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFIn.cpp
# Opt level: O1

void __thiscall NaPNFileInput::set_input_filename(NaPNFileInput *this,char *szFileName)

{
  size_t sVar1;
  char *__dest;
  undefined4 *puVar2;
  
  NaPetriNode::check_tunable(&this->super_NaPetriNode);
  if (szFileName != (char *)0x0) {
    if (this->szDataFName != (char *)0x0) {
      operator_delete__(this->szDataFName);
    }
    this->szDataFName = (char *)0x0;
    sVar1 = strlen(szFileName);
    __dest = (char *)operator_new__(sVar1 + 1);
    this->szDataFName = __dest;
    strcpy(__dest,szFileName);
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

void
NaPNFileInput::set_input_filename (const char* szFileName)
{
    check_tunable();

    if(NULL == szFileName)
        throw(na_null_pointer);

    delete[] szDataFName;  szDataFName = NULL;

    szDataFName = new char[strlen(szFileName) + 1];
    strcpy(szDataFName, szFileName);
}